

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.h
# Opt level: O1

void __thiscall
cmQtAutoGeneratorMocUic::JobUicT::JobUicT
          (JobUicT *this,string *sourceFile,string *includerFile,string *includeString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_JobT)._vptr_JobT = (_func_int **)&PTR__JobUicT_005fc740;
  paVar1 = &(this->SourceFile).field_2;
  (this->SourceFile)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (sourceFile->_M_dataplus)._M_p;
  paVar2 = &sourceFile->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&sourceFile->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->SourceFile).field_2 + 8) = uVar4;
  }
  else {
    (this->SourceFile)._M_dataplus._M_p = pcVar3;
    (this->SourceFile).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->SourceFile)._M_string_length = sourceFile->_M_string_length;
  (sourceFile->_M_dataplus)._M_p = (pointer)paVar2;
  sourceFile->_M_string_length = 0;
  (sourceFile->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->IncluderFile).field_2;
  (this->IncluderFile)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (includerFile->_M_dataplus)._M_p;
  paVar2 = &includerFile->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&includerFile->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->IncluderFile).field_2 + 8) = uVar4;
  }
  else {
    (this->IncluderFile)._M_dataplus._M_p = pcVar3;
    (this->IncluderFile).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->IncluderFile)._M_string_length = includerFile->_M_string_length;
  (includerFile->_M_dataplus)._M_p = (pointer)paVar2;
  includerFile->_M_string_length = 0;
  (includerFile->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->IncludeString).field_2;
  (this->IncludeString)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (includeString->_M_dataplus)._M_p;
  paVar2 = &includeString->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&includeString->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->IncludeString).field_2 + 8) = uVar4;
  }
  else {
    (this->IncludeString)._M_dataplus._M_p = pcVar3;
    (this->IncludeString).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->IncludeString)._M_string_length = includeString->_M_string_length;
  (includeString->_M_dataplus)._M_p = (pointer)paVar2;
  includeString->_M_string_length = 0;
  (includeString->field_2)._M_local_buf[0] = '\0';
  (this->BuildFile)._M_dataplus._M_p = (pointer)&(this->BuildFile).field_2;
  (this->BuildFile)._M_string_length = 0;
  (this->BuildFile).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

JobUicT(std::string&& sourceFile, std::string includerFile,
            std::string&& includeString)
      : SourceFile(std::move(sourceFile))
      , IncluderFile(std::move(includerFile))
      , IncludeString(std::move(includeString))
    {
    }